

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int maxsampleindex;
  uint streamType;
  allocator local_10a;
  allocator local_109;
  string local_108;
  string local_e8;
  sigaction sa;
  
  maxsampleindex = -1;
  streamType = 2;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"vhS:t:");
      if (iVar1 != 0x53) break;
      maxsampleindex = atoi(_optarg);
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x74) {
      if (iVar1 == 0x76) {
        fprintf(_stderr,"%s : version: %s\n",*argv,"");
      }
      else {
        help();
      }
LAB_001015d7:
      exit(1);
    }
    streamType = atoi(_optarg);
  }
  progname = *argv;
  memset(&sa,0,0x98);
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.__sigaction_handler.sa_handler = segfault_sigaction;
  sa.sa_flags = 4;
  sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
  std::__cxx11::string::string((string *)&local_e8,"",&local_109);
  std::__cxx11::string::string((string *)&local_108,"",&local_10a);
  initstreams(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  if (maxsampleindex == -1) {
    fwrite("FATAL: Sample size not supplied - please use -S parameter followed by the sample size\n"
           ,0x56,1,_stderr);
  }
  else {
    if (0xfffffffd < streamType - 3) {
      gultobin::doit(maxsampleindex,streamType);
      return 0;
    }
    fprintf(_stderr,
            "FATAL: Unknown stream type %d - please use 1 for item stream or 2 for loss stream\n",
            (ulong)streamType);
  }
  goto LAB_001015d7;
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	int maxsampleindex = -1;
	int streamType = 2;
	while ((opt = getopt(argc, argv, "vhS:t:")) != -1) {
		switch (opt) {
		case 'S':
			maxsampleindex = atoi(optarg);
			break;
		case 't':
			streamType = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		if (maxsampleindex == -1) {
			fprintf(stderr, "FATAL: Sample size not supplied - please use -S parameter followed by the sample size\n");
			exit(EXIT_FAILURE);
		}
		if (streamType != 1 && streamType != 2) {
			fprintf(stderr, "FATAL: Unknown stream type %d - please use 1 for item stream or 2 for loss stream\n", streamType);
			exit(EXIT_FAILURE);
		}
		gultobin::doit(maxsampleindex, streamType);

		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}